

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pipelines.cpp
# Opt level: O2

void three_parallel_pipelines(size_t L,uint w)

{
  promise<void> *this;
  Node *pNVar1;
  __atomic_base<unsigned_long> _Var2;
  FlowBuilder FVar3;
  array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>
  *__cur;
  long lVar4;
  pointer pcVar5;
  long *plVar6;
  pointer puVar7;
  Node *pNVar8;
  size_t *psVar9;
  pointer p_Var10;
  void *__dest;
  size_type sVar11;
  __atomic_base<unsigned_long> _Var12;
  int iVar13;
  long lVar14;
  size_t l;
  ulong uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  __allocator_type __a2;
  byte local_b00 [8];
  shared_ptr<tf::Topology> t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  __atomic_base<unsigned_long> local_ac0;
  size_type local_ab8;
  atomic<unsigned_long> j3_2;
  size_t j3_1;
  atomic<unsigned_long> j2_3;
  size_t j2_2;
  size_t j2_1;
  size_t j1_4;
  size_t j1_3;
  size_t j1_2;
  size_t j1_1;
  promise<void> promise;
  Task test3;
  Task pipeline3;
  size_t cnt3;
  Task test2;
  Task pipeline2;
  size_t cnt2;
  Task test1;
  Task pipeline1;
  size_t cnt1;
  vector<int,_std::allocator<int>_> source;
  vector<int,_std::allocator<int>_> collection3_2;
  vector<int,_std::allocator<int>_> collection2_3;
  anon_class_136_17_4ca99117 local_960;
  size_type local_8d8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_8d0;
  size_t *local_8c8;
  __node_base *local_8c0;
  __node_base_ptr *local_8b8;
  __node_base *local_8b0;
  size_t *local_8a8;
  __node_base *local_8a0;
  __node_base_ptr *local_898;
  size_t *local_890;
  __node_base *local_888;
  Task terminal;
  Task initial;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> mybuffer3;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> mybuffer2;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> mybuffer1;
  mutex mutex3_2;
  undefined1 local_7f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  byte local_7d0 [8];
  Topology *local_7c8;
  Node *local_7c0;
  vector<int,_std::allocator<int>_> *local_7b8;
  byte local_7b0 [8];
  void *local_7a8;
  PipeType local_7a0;
  U local_798;
  U local_790;
  U local_788;
  U local_780;
  atomic<unsigned_long> local_778;
  _Variadic_union<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  local_770;
  PipeMeta local_738;
  __uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_> local_730;
  exception_ptr eStack_728;
  pointer local_720;
  vector<tf::Task,_std::allocator<tf::Task>_> local_718;
  vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> local_700;
  queue<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_6e8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_698;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_660;
  shared_ptr<tf::WorkerInterface> local_618;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
  local_608;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  local_468;
  undefined8 local_268;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_260;
  mutex mutex2_3;
  Taskflow taskflow;
  Executor executor;
  
  local_618.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_618.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)w,&local_618);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_618.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::vector<int,_std::allocator<int>_>::vector(&source,100,(allocator_type *)&local_468);
  iVar13 = 0;
  for (; source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1) {
    *source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         iVar13;
    iVar13 = iVar13 + 1;
  }
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
            (&mybuffer1,L,(allocator_type *)&local_468);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            (&mybuffer2,L,(allocator_type *)&local_468);
  std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::vector
            (&mybuffer3,L,(allocator_type *)&local_468);
  local_888 = &local_468._token_dependencies._M_h._M_before_begin;
  local_898 = &local_698._M_single_bucket;
  local_890 = &local_660._M_rehash_policy._M_next_resize;
  local_8b0 = &local_608._token_dependencies._M_h._M_before_begin;
  local_8b8 = &local_608._deferred_tokens._M_h._M_single_bucket;
  local_8a0 = &local_698._M_before_begin;
  local_8c0 = &local_608._deferred_tokens._M_h._M_before_begin;
  local_8a8 = &local_698._M_rehash_policy._M_next_resize;
  local_8c8 = &local_608._deferred_tokens._M_h._M_rehash_policy._M_next_resize;
  local_ab8 = L + 1;
  local_b00[0] = 0;
  local_b00[1] = 0;
  local_b00[2] = 0;
  local_b00[3] = 0;
  local_b00[4] = 0;
  local_b00[5] = 0;
  local_b00[6] = 0;
  local_b00[7] = 0;
  local_ac0._M_i = L;
  while( true ) {
    _Var2._M_i = local_ac0._M_i;
    if (100 < (ulong)local_b00) {
      std::_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~_Vector_base
                (&mybuffer3.
                  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>);
      std::_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~_Vector_base
                (&mybuffer2.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>);
      std::_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~_Vector_base
                (&mybuffer1.
                  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&source.super__Vector_base<int,_std::allocator<int>_>);
      tf::Executor::~Executor(&executor);
      return;
    }
    tf::Taskflow::Taskflow(&taskflow);
    j1_1 = 0;
    j1_2 = 0;
    j1_3 = 0;
    local_468._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_468._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_468._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
    ._M_head_impl._type = SERIAL;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
    ._M_head_impl._callable.N._0_1_ = local_b00[0];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
    ._M_head_impl._callable.N._1_1_ = local_b00[1];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
    ._M_head_impl._callable.N._2_1_ = local_b00[2];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
    ._M_head_impl._callable.N._3_1_ = local_b00[3];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
    ._M_head_impl._callable.N._4_1_ = local_b00[4];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
    ._M_head_impl._callable.N._5_1_ = local_b00[5];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
    ._M_head_impl._callable.N._6_1_ = local_b00[6];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
    ._M_head_impl._callable.N._7_1_ = local_b00[7];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
    ._M_head_impl._callable.source = &source;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
    ._M_head_impl._callable.j1_4 = &j1_4;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
    ._M_head_impl._callable.mybuffer1 = &mybuffer1;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_false>
    ._M_head_impl._callable.N._0_1_ = local_b00[0];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_false>
    ._M_head_impl._callable.N._1_1_ = local_b00[1];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_false>
    ._M_head_impl._callable.N._2_1_ = local_b00[2];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_false>
    ._M_head_impl._callable.N._3_1_ = local_b00[3];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_false>
    ._M_head_impl._callable.N._4_1_ = local_b00[4];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_false>
    ._M_head_impl._callable.N._5_1_ = local_b00[5];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_false>
    ._M_head_impl._callable.N._6_1_ = local_b00[6];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_false>
    ._M_head_impl._callable.N._7_1_ = local_b00[7];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_false>
    ._M_head_impl._callable.j1_3 = &j1_3;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_false>
    ._M_head_impl._callable.N._0_1_ = local_b00[0];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_false>
    ._M_head_impl._callable.N._1_1_ = local_b00[1];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_false>
    ._M_head_impl._callable.N._2_1_ = local_b00[2];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_false>
    ._M_head_impl._callable.N._3_1_ = local_b00[3];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_false>
    ._M_head_impl._callable.N._4_1_ = local_b00[4];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_false>
    ._M_head_impl._callable.N._5_1_ = local_b00[5];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_false>
    ._M_head_impl._callable.N._6_1_ = local_b00[6];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_false>
    ._M_head_impl._callable.N._7_1_ = local_b00[7];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_false>
    ._M_head_impl._callable.j1_2 = &j1_2;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
    ._M_head_impl._callable.N._0_1_ = local_b00[0];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
    ._M_head_impl._callable.N._1_1_ = local_b00[1];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
    ._M_head_impl._callable.N._2_1_ = local_b00[2];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
    ._M_head_impl._callable.N._3_1_ = local_b00[3];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
    ._M_head_impl._callable.N._4_1_ = local_b00[4];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
    ._M_head_impl._callable.N._5_1_ = local_b00[5];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
    ._M_head_impl._callable.N._6_1_ = local_b00[6];
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
    ._M_head_impl._callable.N._7_1_ = local_b00[7];
    j1_4 = 0;
    cnt1 = 1;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
    ._M_head_impl._callable.j1_1 = &j1_1;
    local_468._meta._M_elems[0].type = SERIAL;
    local_468._meta._M_elems[1].type = SERIAL;
    local_468._meta._M_elems[2].type = SERIAL;
    local_468._meta._M_elems[3].type = SERIAL;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
    ._M_head_impl._callable.L = (size_t)_Var2;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_false>
    ._M_head_impl._type =
         local_468._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
         ._M_head_impl._type;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_false>
    ._M_head_impl._callable.source =
         local_468._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
         ._M_head_impl._callable.source;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_false>
    ._M_head_impl._callable.mybuffer1 =
         local_468._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
         ._M_head_impl._callable.mybuffer1;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_false>
    ._M_head_impl._callable.L = (size_t)_Var2;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_false>
    ._M_head_impl._type =
         local_468._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
         ._M_head_impl._type;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_false>
    ._M_head_impl._callable.source =
         local_468._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
         ._M_head_impl._callable.source;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_false>
    ._M_head_impl._callable.mybuffer1 =
         local_468._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
         ._M_head_impl._callable.mybuffer1;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_false>
    ._M_head_impl._callable.L = (size_t)_Var2;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
    ._M_head_impl._type =
         local_468._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
         ._M_head_impl._type;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
    ._M_head_impl._callable.source =
         local_468._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
         ._M_head_impl._callable.source;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
    ._M_head_impl._callable.mybuffer1 =
         local_468._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Tuple_impl<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
         .
         super__Head_base<3UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>,_false>
         ._M_head_impl._callable.mybuffer1;
    local_468._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
    ._M_head_impl._callable.L = (size_t)_Var2;
    if (_Var2._M_i >> 0x3a != 0) break;
    local_468._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_468._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_468._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((void *)_Var2._M_i == (void *)0x0) {
      local_468._lines.
      super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      local_468._lines.
      super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(L * 0x20);
    }
    local_468._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_468._lines.
         super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start + L;
    local_468._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_468._lines.
         super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    _Var12._M_i = _Var2._M_i;
    while (bVar16 = (void *)_Var12._M_i != (void *)0x0, _Var12._M_i = _Var12._M_i - 1, bVar16) {
      (local_468._lines.
       super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[2].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      (local_468._lines.
       super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[3].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      (local_468._lines.
       super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[0].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      (local_468._lines.
       super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[1].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      local_468._lines.
      super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_468._lines.
           super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
              (&local_468._tasks,local_ab8,(allocator_type *)local_7f8);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
              (&local_468._pipeflows,_Var2._M_i,(allocator_type *)local_7f8);
    std::
    queue<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
    ::
    queue<std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>,void>
              (&local_468._ready_tokens);
    local_468._token_dependencies._M_h._M_buckets =
         &local_468._token_dependencies._M_h._M_single_bucket;
    local_468._token_dependencies._M_h._M_bucket_count = 1;
    local_888->_M_nxt = (_Hash_node_base *)0x0;
    local_888[1] = (_Hash_node_base *)0x0;
    local_468._token_dependencies._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_468._token_dependencies._M_h._M_rehash_policy._M_next_resize = 0;
    local_468._token_dependencies._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_468._deferred_tokens._M_h._M_buckets = &local_468._deferred_tokens._M_h._M_single_bucket;
    local_468._deferred_tokens._M_h._M_bucket_count = 1;
    local_468._deferred_tokens._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_468._deferred_tokens._M_h._M_element_count = 0;
    local_468._deferred_tokens._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_468._longest_deferral = 0;
    local_468._deferred_tokens._M_h._M_rehash_policy._M_next_resize = 0;
    local_468._deferred_tokens._M_h._M_single_bucket = (__node_base_ptr)0x0;
    if ((void *)_Var2._M_i == (void *)0x0) {
      tf::throw_re<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x22e,(char (*) [28])"must have at least one line");
    }
    if (local_468._pipes.
        super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
        .
        super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_false>
        ._M_head_impl._type != SERIAL) {
      tf::throw_re<char_const(&)[26]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x232,(char (*) [26])"first pipe must be serial");
    }
    local_468._num_tokens = 0;
    lVar14 = 0x28;
    for (uVar15 = 0;
        uVar15 < (ulong)(((long)local_468._pipeflows.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_468._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar15 = uVar15 + 1) {
      *(undefined8 *)
       ((long)local_468._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar14 + -0x20) = 0;
      *(ulong *)((long)local_468._pipeflows.
                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar14 + -0x28) = uVar15;
      *(undefined8 *)
       ((long)local_468._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar14 + -8) = 0;
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)((long)&(local_468._pipeflows.
                          super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                          super__Vector_impl_data._M_start)->_line + lVar14));
      lVar14 = lVar14 + 0x60;
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&local_468._token_dependencies._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&local_468._deferred_tokens._M_h);
    (local_468._lines.
     super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
    super___atomic_base<unsigned_long>._M_i = 0;
    lVar14 = 0x28;
    for (uVar15 = 1;
        uVar15 < (ulong)(((long)local_468._pipeflows.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_468._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar15 = uVar15 + 1) {
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        *(long *)((long)&(local_468._lines.
                          super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar4].join_counter.
                         super___atomic_base<unsigned_long>._M_i + lVar14) =
             (long)(int)local_468._meta._M_elems[lVar4 + 1].type;
      }
      lVar14 = lVar14 + 0x20;
    }
    for (lVar14 = 1; lVar14 != 4; lVar14 = lVar14 + 1) {
      (local_468._lines.
       super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar14].join_counter.
      super___atomic_base<unsigned_long>._M_i = 1;
    }
    lVar14 = 0x20;
    for (uVar15 = 1;
        uVar15 < (ulong)(((long)local_468._pipeflows.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_468._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar15 = uVar15 + 1) {
      *(long *)((long)&(local_468._lines.
                        super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>::Line,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
                       super___atomic_base<unsigned_long>._M_i + lVar14) =
           (long)(int)local_468._meta._M_elems[0].type + -1;
      lVar14 = lVar14 + 0x20;
    }
    local_7f8._0_8_ = operator_new(0xd8);
    *(char *)(local_7f8._0_8_ + 0) = '\0';
    *(char *)(local_7f8._0_8_ + 1) = '\0';
    *(char *)(local_7f8._0_8_ + 2) = '\0';
    *(char *)(local_7f8._0_8_ + 3) = '\0';
    *(char *)(local_7f8._0_8_ + 4) = '\0';
    *(char *)(local_7f8._0_8_ + 5) = '\0';
    *(char *)(local_7f8._0_8_ + 6) = '\0';
    *(char *)(local_7f8._0_8_ + 7) = '\0';
    *(pointer *)(local_7f8._0_8_ + 8) = (pointer)(local_7f8._0_8_ + 0x18);
    *(char *)(local_7f8._0_8_ + 0x10) = '\0';
    *(char *)(local_7f8._0_8_ + 0x11) = '\0';
    *(char *)(local_7f8._0_8_ + 0x12) = '\0';
    *(char *)(local_7f8._0_8_ + 0x13) = '\0';
    *(char *)(local_7f8._0_8_ + 0x14) = '\0';
    *(char *)(local_7f8._0_8_ + 0x15) = '\0';
    *(char *)(local_7f8._0_8_ + 0x16) = '\0';
    *(char *)(local_7f8._0_8_ + 0x17) = '\0';
    *(char *)(local_7f8._0_8_ + 0x18) = '\0';
    *(char *)(local_7f8._0_8_ + 0x28) = '\0';
    *(char *)(local_7f8._0_8_ + 0x29) = '\0';
    *(char *)(local_7f8._0_8_ + 0x2a) = '\0';
    *(char *)(local_7f8._0_8_ + 0x2b) = '\0';
    *(char *)(local_7f8._0_8_ + 0x2c) = '\0';
    *(char *)(local_7f8._0_8_ + 0x2d) = '\0';
    *(char *)(local_7f8._0_8_ + 0x2e) = '\0';
    *(char *)(local_7f8._0_8_ + 0x2f) = '\0';
    *(char *)(local_7f8._0_8_ + 0x30) = '\0';
    *(char *)(local_7f8._0_8_ + 0x31) = '\0';
    *(char *)(local_7f8._0_8_ + 0x32) = '\0';
    *(char *)(local_7f8._0_8_ + 0x33) = '\0';
    *(char *)(local_7f8._0_8_ + 0x34) = '\0';
    *(char *)(local_7f8._0_8_ + 0x35) = '\0';
    *(char *)(local_7f8._0_8_ + 0x36) = '\0';
    *(char *)(local_7f8._0_8_ + 0x37) = '\0';
    *(char *)(local_7f8._0_8_ + 0x38) = '\0';
    *(char *)(local_7f8._0_8_ + 0x39) = '\0';
    *(char *)(local_7f8._0_8_ + 0x3a) = '\0';
    *(char *)(local_7f8._0_8_ + 0x3b) = '\0';
    *(char *)(local_7f8._0_8_ + 0x3c) = '\0';
    *(char *)(local_7f8._0_8_ + 0x3d) = '\0';
    *(char *)(local_7f8._0_8_ + 0x3e) = '\0';
    *(char *)(local_7f8._0_8_ + 0x3f) = '\0';
    *(char *)(local_7f8._0_8_ + 0x40) = '\0';
    *(char *)(local_7f8._0_8_ + 0x41) = '\0';
    *(char *)(local_7f8._0_8_ + 0x42) = '\0';
    *(char *)(local_7f8._0_8_ + 0x43) = '\0';
    *(char *)(local_7f8._0_8_ + 0x44) = '\0';
    *(char *)(local_7f8._0_8_ + 0x45) = '\0';
    *(char *)(local_7f8._0_8_ + 0x46) = '\0';
    *(char *)(local_7f8._0_8_ + 0x47) = '\0';
    *(pointer *)(local_7f8._0_8_ + 0x48) = (pointer)(local_7f8._0_8_ + 0x60);
    *(pointer *)(local_7f8._0_8_ + 0x50) = (pointer)(local_7f8._0_8_ + 0x60);
    *(pointer *)(local_7f8._0_8_ + 0x58) = (pointer)(local_7f8._0_8_ + 0x80);
    *(char *)(local_7f8._0_8_ + 0x80) = '\0';
    *(char *)(local_7f8._0_8_ + 0x81) = '\0';
    *(char *)(local_7f8._0_8_ + 0x82) = '\0';
    *(char *)(local_7f8._0_8_ + 0x83) = '\0';
    *(char *)(local_7f8._0_8_ + 0x84) = '\0';
    *(char *)(local_7f8._0_8_ + 0x85) = '\0';
    *(char *)(local_7f8._0_8_ + 0x86) = '\0';
    *(char *)(local_7f8._0_8_ + 0x87) = '\0';
    *(char *)(local_7f8._0_8_ + 0x90) = '\0';
    *(char *)(local_7f8._0_8_ + 0x91) = '\0';
    *(char *)(local_7f8._0_8_ + 0x92) = '\0';
    *(char *)(local_7f8._0_8_ + 0x93) = '\0';
    *(char *)(local_7f8._0_8_ + 0x94) = '\0';
    *(char *)(local_7f8._0_8_ + 0x95) = '\0';
    *(char *)(local_7f8._0_8_ + 0x96) = '\0';
    *(char *)(local_7f8._0_8_ + 0x97) = '\0';
    *(Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
      **)(local_7f8._0_8_ + 0x88) = &local_468;
    *(code **)(local_7f8._0_8_ + 0xa0) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
         ::_M_invoke;
    *(code **)(local_7f8._0_8_ + 0x98) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
         ::_M_manager;
    *(char *)(local_7f8._0_8_ + 0xc0) = '\x04';
    *(char *)(local_7f8._0_8_ + 200) = '\0';
    *(char *)(local_7f8._0_8_ + 0xc9) = '\0';
    *(char *)(local_7f8._0_8_ + 0xca) = '\0';
    *(char *)(local_7f8._0_8_ + 0xcb) = '\0';
    *(char *)(local_7f8._0_8_ + 0xcc) = '\0';
    *(char *)(local_7f8._0_8_ + 0xcd) = '\0';
    *(char *)(local_7f8._0_8_ + 0xce) = '\0';
    *(char *)(local_7f8._0_8_ + 0xcf) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd0) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd1) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd2) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd3) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd4) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd5) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd6) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd7) = '\0';
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)&local_468,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)local_7f8);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)local_7f8);
    pNVar8 = local_468._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_7f8,"cond",(allocator<char> *)&local_608);
    std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
    (local_468._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
     super__Vector_impl_data._M_start)->_node = pNVar8;
    std::__cxx11::string::~string((string *)local_7f8);
    uVar15 = 0;
    while( true ) {
      FVar3._graph = taskflow.super_FlowBuilder._graph;
      if ((ulong)(((long)local_468._pipeflows.
                         super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)local_468._pipeflows.
                        super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x60) <= uVar15) break;
      local_7f8._0_8_ = operator_new(0xd8);
      *(char *)(local_7f8._0_8_ + 0) = '\0';
      *(char *)(local_7f8._0_8_ + 1) = '\0';
      *(char *)(local_7f8._0_8_ + 2) = '\0';
      *(char *)(local_7f8._0_8_ + 3) = '\0';
      *(char *)(local_7f8._0_8_ + 4) = '\0';
      *(char *)(local_7f8._0_8_ + 5) = '\0';
      *(char *)(local_7f8._0_8_ + 6) = '\0';
      *(char *)(local_7f8._0_8_ + 7) = '\0';
      *(pointer *)(local_7f8._0_8_ + 8) = (pointer)(local_7f8._0_8_ + 0x18);
      *(char *)(local_7f8._0_8_ + 0x10) = '\0';
      *(char *)(local_7f8._0_8_ + 0x11) = '\0';
      *(char *)(local_7f8._0_8_ + 0x12) = '\0';
      *(char *)(local_7f8._0_8_ + 0x13) = '\0';
      *(char *)(local_7f8._0_8_ + 0x14) = '\0';
      *(char *)(local_7f8._0_8_ + 0x15) = '\0';
      *(char *)(local_7f8._0_8_ + 0x16) = '\0';
      *(char *)(local_7f8._0_8_ + 0x17) = '\0';
      *(char *)(local_7f8._0_8_ + 0x18) = '\0';
      *(char *)(local_7f8._0_8_ + 0x28) = '\0';
      *(char *)(local_7f8._0_8_ + 0x29) = '\0';
      *(char *)(local_7f8._0_8_ + 0x2a) = '\0';
      *(char *)(local_7f8._0_8_ + 0x2b) = '\0';
      *(char *)(local_7f8._0_8_ + 0x2c) = '\0';
      *(char *)(local_7f8._0_8_ + 0x2d) = '\0';
      *(char *)(local_7f8._0_8_ + 0x2e) = '\0';
      *(char *)(local_7f8._0_8_ + 0x2f) = '\0';
      *(char *)(local_7f8._0_8_ + 0x30) = '\0';
      *(char *)(local_7f8._0_8_ + 0x31) = '\0';
      *(char *)(local_7f8._0_8_ + 0x32) = '\0';
      *(char *)(local_7f8._0_8_ + 0x33) = '\0';
      *(char *)(local_7f8._0_8_ + 0x34) = '\0';
      *(char *)(local_7f8._0_8_ + 0x35) = '\0';
      *(char *)(local_7f8._0_8_ + 0x36) = '\0';
      *(char *)(local_7f8._0_8_ + 0x37) = '\0';
      *(char *)(local_7f8._0_8_ + 0x38) = '\0';
      *(char *)(local_7f8._0_8_ + 0x39) = '\0';
      *(char *)(local_7f8._0_8_ + 0x3a) = '\0';
      *(char *)(local_7f8._0_8_ + 0x3b) = '\0';
      *(char *)(local_7f8._0_8_ + 0x3c) = '\0';
      *(char *)(local_7f8._0_8_ + 0x3d) = '\0';
      *(char *)(local_7f8._0_8_ + 0x3e) = '\0';
      *(char *)(local_7f8._0_8_ + 0x3f) = '\0';
      *(char *)(local_7f8._0_8_ + 0x40) = '\0';
      *(char *)(local_7f8._0_8_ + 0x41) = '\0';
      *(char *)(local_7f8._0_8_ + 0x42) = '\0';
      *(char *)(local_7f8._0_8_ + 0x43) = '\0';
      *(char *)(local_7f8._0_8_ + 0x44) = '\0';
      *(char *)(local_7f8._0_8_ + 0x45) = '\0';
      *(char *)(local_7f8._0_8_ + 0x46) = '\0';
      *(char *)(local_7f8._0_8_ + 0x47) = '\0';
      *(pointer *)(local_7f8._0_8_ + 0x48) = (pointer)(local_7f8._0_8_ + 0x60);
      *(pointer *)(local_7f8._0_8_ + 0x50) = (pointer)(local_7f8._0_8_ + 0x60);
      *(pointer *)(local_7f8._0_8_ + 0x58) = (pointer)(local_7f8._0_8_ + 0x80);
      *(char *)(local_7f8._0_8_ + 0x80) = '\0';
      *(char *)(local_7f8._0_8_ + 0x81) = '\0';
      *(char *)(local_7f8._0_8_ + 0x82) = '\0';
      *(char *)(local_7f8._0_8_ + 0x83) = '\0';
      *(char *)(local_7f8._0_8_ + 0x84) = '\0';
      *(char *)(local_7f8._0_8_ + 0x85) = '\0';
      *(char *)(local_7f8._0_8_ + 0x86) = '\0';
      *(char *)(local_7f8._0_8_ + 0x87) = '\0';
      *(Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
        **)(local_7f8._0_8_ + 0x88) = &local_468;
      *(ulong *)(local_7f8._0_8_ + 0x90) = uVar15;
      *(code **)(local_7f8._0_8_ + 0xa0) =
           std::
           _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
           ::_M_invoke;
      *(code **)(local_7f8._0_8_ + 0x98) =
           std::
           _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
           ::_M_manager;
      *(char *)(local_7f8._0_8_ + 0xc0) = '\x02';
      *(char *)(local_7f8._0_8_ + 200) = '\0';
      *(char *)(local_7f8._0_8_ + 0xc9) = '\0';
      *(char *)(local_7f8._0_8_ + 0xca) = '\0';
      *(char *)(local_7f8._0_8_ + 0xcb) = '\0';
      *(char *)(local_7f8._0_8_ + 0xcc) = '\0';
      *(char *)(local_7f8._0_8_ + 0xcd) = '\0';
      *(char *)(local_7f8._0_8_ + 0xce) = '\0';
      *(char *)(local_7f8._0_8_ + 0xcf) = '\0';
      *(char *)(local_7f8._0_8_ + 0xd0) = '\0';
      *(char *)(local_7f8._0_8_ + 0xd1) = '\0';
      *(char *)(local_7f8._0_8_ + 0xd2) = '\0';
      *(char *)(local_7f8._0_8_ + 0xd3) = '\0';
      *(char *)(local_7f8._0_8_ + 0xd4) = '\0';
      *(char *)(local_7f8._0_8_ + 0xd5) = '\0';
      *(char *)(local_7f8._0_8_ + 0xd6) = '\0';
      *(char *)(local_7f8._0_8_ + 0xd7) = '\0';
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)&local_468,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)local_7f8);
      std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
                ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)local_7f8);
      pNVar8 = local_468._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               .
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
               super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
               super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_608,
                   "rt-",3);
      std::__cxx11::to_string((string *)&local_960,uVar15);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_608
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_960);
      std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
      local_468._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
      super__Vector_impl_data._M_start[uVar15 + 1]._node = pNVar8;
      std::__cxx11::string::~string((string *)local_7f8);
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::~string((string *)&local_608);
      tf::Task::precede<tf::Task&>
                (local_468._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_468._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar15 + 1);
      uVar15 = uVar15 + 1;
    }
    local_7f8._0_8_ = operator_new(0xd8);
    *(char *)(local_7f8._0_8_ + 0) = '\0';
    *(char *)(local_7f8._0_8_ + 1) = '\0';
    *(char *)(local_7f8._0_8_ + 2) = '\0';
    *(char *)(local_7f8._0_8_ + 3) = '\0';
    *(char *)(local_7f8._0_8_ + 4) = '\0';
    *(char *)(local_7f8._0_8_ + 5) = '\0';
    *(char *)(local_7f8._0_8_ + 6) = '\0';
    *(char *)(local_7f8._0_8_ + 7) = '\0';
    *(pointer *)(local_7f8._0_8_ + 8) = (pointer)(local_7f8._0_8_ + 0x18);
    *(char *)(local_7f8._0_8_ + 0x10) = '\0';
    *(char *)(local_7f8._0_8_ + 0x11) = '\0';
    *(char *)(local_7f8._0_8_ + 0x12) = '\0';
    *(char *)(local_7f8._0_8_ + 0x13) = '\0';
    *(char *)(local_7f8._0_8_ + 0x14) = '\0';
    *(char *)(local_7f8._0_8_ + 0x15) = '\0';
    *(char *)(local_7f8._0_8_ + 0x16) = '\0';
    *(char *)(local_7f8._0_8_ + 0x17) = '\0';
    *(char *)(local_7f8._0_8_ + 0x18) = '\0';
    *(char *)(local_7f8._0_8_ + 0x28) = '\0';
    *(char *)(local_7f8._0_8_ + 0x29) = '\0';
    *(char *)(local_7f8._0_8_ + 0x2a) = '\0';
    *(char *)(local_7f8._0_8_ + 0x2b) = '\0';
    *(char *)(local_7f8._0_8_ + 0x2c) = '\0';
    *(char *)(local_7f8._0_8_ + 0x2d) = '\0';
    *(char *)(local_7f8._0_8_ + 0x2e) = '\0';
    *(char *)(local_7f8._0_8_ + 0x2f) = '\0';
    *(char *)(local_7f8._0_8_ + 0x30) = '\0';
    *(char *)(local_7f8._0_8_ + 0x31) = '\0';
    *(char *)(local_7f8._0_8_ + 0x32) = '\0';
    *(char *)(local_7f8._0_8_ + 0x33) = '\0';
    *(char *)(local_7f8._0_8_ + 0x34) = '\0';
    *(char *)(local_7f8._0_8_ + 0x35) = '\0';
    *(char *)(local_7f8._0_8_ + 0x36) = '\0';
    *(char *)(local_7f8._0_8_ + 0x37) = '\0';
    *(char *)(local_7f8._0_8_ + 0x38) = '\0';
    *(char *)(local_7f8._0_8_ + 0x39) = '\0';
    *(char *)(local_7f8._0_8_ + 0x3a) = '\0';
    *(char *)(local_7f8._0_8_ + 0x3b) = '\0';
    *(char *)(local_7f8._0_8_ + 0x3c) = '\0';
    *(char *)(local_7f8._0_8_ + 0x3d) = '\0';
    *(char *)(local_7f8._0_8_ + 0x3e) = '\0';
    *(char *)(local_7f8._0_8_ + 0x3f) = '\0';
    *(char *)(local_7f8._0_8_ + 0x40) = '\0';
    *(char *)(local_7f8._0_8_ + 0x41) = '\0';
    *(char *)(local_7f8._0_8_ + 0x42) = '\0';
    *(char *)(local_7f8._0_8_ + 0x43) = '\0';
    *(char *)(local_7f8._0_8_ + 0x44) = '\0';
    *(char *)(local_7f8._0_8_ + 0x45) = '\0';
    *(char *)(local_7f8._0_8_ + 0x46) = '\0';
    *(char *)(local_7f8._0_8_ + 0x47) = '\0';
    *(pointer *)(local_7f8._0_8_ + 0x48) = (pointer)(local_7f8._0_8_ + 0x60);
    *(pointer *)(local_7f8._0_8_ + 0x50) = (pointer)(local_7f8._0_8_ + 0x60);
    *(pointer *)(local_7f8._0_8_ + 0x58) = (pointer)(local_7f8._0_8_ + 0x80);
    *(char *)(local_7f8._0_8_ + 0x80) = '\0';
    *(char *)(local_7f8._0_8_ + 0x81) = '\0';
    *(char *)(local_7f8._0_8_ + 0x82) = '\0';
    *(char *)(local_7f8._0_8_ + 0x83) = '\0';
    *(char *)(local_7f8._0_8_ + 0x84) = '\0';
    *(char *)(local_7f8._0_8_ + 0x85) = '\0';
    *(char *)(local_7f8._0_8_ + 0x86) = '\0';
    *(char *)(local_7f8._0_8_ + 0x87) = '\0';
    *(Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
      **)(local_7f8._0_8_ + 0x88) = &local_468;
    *(char *)(local_7f8._0_8_ + 0xc0) = '\x06';
    *(char *)(local_7f8._0_8_ + 200) = '\0';
    *(char *)(local_7f8._0_8_ + 0xc9) = '\0';
    *(char *)(local_7f8._0_8_ + 0xca) = '\0';
    *(char *)(local_7f8._0_8_ + 0xcb) = '\0';
    *(char *)(local_7f8._0_8_ + 0xcc) = '\0';
    *(char *)(local_7f8._0_8_ + 0xcd) = '\0';
    *(char *)(local_7f8._0_8_ + 0xce) = '\0';
    *(char *)(local_7f8._0_8_ + 0xcf) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd0) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd1) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd2) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd3) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd4) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd5) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd6) = '\0';
    *(char *)(local_7f8._0_8_ + 0xd7) = '\0';
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar3._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)local_7f8);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)local_7f8);
    pNVar8 = ((FVar3._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_7f8,"module_of_pipeline1",(allocator<char> *)&local_608);
    std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
    pipeline1._node = pNVar8;
    std::__cxx11::string::~string((string *)local_7f8);
    FVar3 = taskflow.super_FlowBuilder;
    pcVar5 = (pointer)operator_new(0xd8);
    pcVar5[0] = '\0';
    pcVar5[1] = '\0';
    pcVar5[2] = '\0';
    pcVar5[3] = '\0';
    pcVar5[4] = '\0';
    pcVar5[5] = '\0';
    pcVar5[6] = '\0';
    pcVar5[7] = '\0';
    *(pointer *)(pcVar5 + 8) = pcVar5 + 0x18;
    pcVar5[0x10] = '\0';
    pcVar5[0x11] = '\0';
    pcVar5[0x12] = '\0';
    pcVar5[0x13] = '\0';
    pcVar5[0x14] = '\0';
    pcVar5[0x15] = '\0';
    pcVar5[0x16] = '\0';
    pcVar5[0x17] = '\0';
    pcVar5[0x18] = '\0';
    pcVar5[0x28] = '\0';
    pcVar5[0x29] = '\0';
    pcVar5[0x2a] = '\0';
    pcVar5[0x2b] = '\0';
    pcVar5[0x2c] = '\0';
    pcVar5[0x2d] = '\0';
    pcVar5[0x2e] = '\0';
    pcVar5[0x2f] = '\0';
    pcVar5[0x30] = '\0';
    pcVar5[0x31] = '\0';
    pcVar5[0x32] = '\0';
    pcVar5[0x33] = '\0';
    pcVar5[0x34] = '\0';
    pcVar5[0x35] = '\0';
    pcVar5[0x36] = '\0';
    pcVar5[0x37] = '\0';
    pcVar5[0x38] = '\0';
    pcVar5[0x39] = '\0';
    pcVar5[0x3a] = '\0';
    pcVar5[0x3b] = '\0';
    pcVar5[0x3c] = '\0';
    pcVar5[0x3d] = '\0';
    pcVar5[0x3e] = '\0';
    pcVar5[0x3f] = '\0';
    pcVar5[0x40] = '\0';
    pcVar5[0x41] = '\0';
    pcVar5[0x42] = '\0';
    pcVar5[0x43] = '\0';
    pcVar5[0x44] = '\0';
    pcVar5[0x45] = '\0';
    pcVar5[0x46] = '\0';
    pcVar5[0x47] = '\0';
    *(pointer *)(pcVar5 + 0x48) = pcVar5 + 0x60;
    *(pointer *)(pcVar5 + 0x50) = pcVar5 + 0x60;
    *(pointer *)(pcVar5 + 0x58) = pcVar5 + 0x80;
    pcVar5[0x80] = '\0';
    pcVar5[0x81] = '\0';
    pcVar5[0x82] = '\0';
    pcVar5[0x83] = '\0';
    pcVar5[0x84] = '\0';
    pcVar5[0x85] = '\0';
    pcVar5[0x86] = '\0';
    pcVar5[0x87] = '\0';
    pcVar5[0x88] = '\0';
    pcVar5[0x89] = '\0';
    pcVar5[0x8a] = '\0';
    pcVar5[0x8b] = '\0';
    pcVar5[0x8c] = '\0';
    pcVar5[0x8d] = '\0';
    pcVar5[0x8e] = '\0';
    pcVar5[0x8f] = '\0';
    pcVar5[0x90] = '\0';
    pcVar5[0x91] = '\0';
    pcVar5[0x92] = '\0';
    pcVar5[0x93] = '\0';
    pcVar5[0x94] = '\0';
    pcVar5[0x95] = '\0';
    pcVar5[0x96] = '\0';
    pcVar5[0x97] = '\0';
    pcVar5[0x98] = '\0';
    pcVar5[0x99] = '\0';
    pcVar5[0x9a] = '\0';
    pcVar5[0x9b] = '\0';
    pcVar5[0x9c] = '\0';
    pcVar5[0x9d] = '\0';
    pcVar5[0x9e] = '\0';
    pcVar5[0x9f] = '\0';
    pcVar5[0xa0] = '\0';
    pcVar5[0xa1] = '\0';
    pcVar5[0xa2] = '\0';
    pcVar5[0xa3] = '\0';
    pcVar5[0xa4] = '\0';
    pcVar5[0xa5] = '\0';
    pcVar5[0xa6] = '\0';
    pcVar5[0xa7] = '\0';
    plVar6 = (long *)operator_new(0x38);
    *plVar6 = (long)&j1_1;
    plVar6[1] = (long)local_b00;
    plVar6[2] = (long)&j1_2;
    plVar6[3] = (long)&j1_3;
    plVar6[4] = (long)&j1_4;
    plVar6[5] = (long)&local_468;
    plVar6[6] = (long)&cnt1;
    *(long **)(pcVar5 + 0x88) = plVar6;
    *(code **)(pcVar5 + 0xa0) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1110:35)>
         ::_M_invoke;
    *(code **)(pcVar5 + 0x98) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1110:35)>
         ::_M_manager;
    pcVar5[0xc0] = '\x01';
    pcVar5[200] = '\0';
    pcVar5[0xc9] = '\0';
    pcVar5[0xca] = '\0';
    pcVar5[0xcb] = '\0';
    pcVar5[0xcc] = '\0';
    pcVar5[0xcd] = '\0';
    pcVar5[0xce] = '\0';
    pcVar5[0xcf] = '\0';
    pcVar5[0xd0] = '\0';
    pcVar5[0xd1] = '\0';
    pcVar5[0xd2] = '\0';
    pcVar5[0xd3] = '\0';
    pcVar5[0xd4] = '\0';
    pcVar5[0xd5] = '\0';
    pcVar5[0xd6] = '\0';
    pcVar5[0xd7] = '\0';
    local_7f8._0_8_ = pcVar5;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar3._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)local_7f8);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)local_7f8);
    pNVar8 = ((FVar3._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_7f8,"test1",(allocator<char> *)&local_608);
    std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
    test1._node = pNVar8;
    std::__cxx11::string::~string((string *)local_7f8);
    tf::Node::_precede(pipeline1._node,test1._node);
    _Var2._M_i = local_ac0._M_i;
    j2_1 = 0;
    j2_2 = 0;
    j2_3.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    mutex2_3.super___mutex_base._M_mutex._16_8_ = 0;
    mutex2_3.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    mutex2_3.super___mutex_base._M_mutex.__align = 0;
    mutex2_3.super___mutex_base._M_mutex._8_8_ = 0;
    mutex2_3.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    collection2_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_7f8._0_8_ = (pointer)0x0;
    local_7f8._8_8_ = (pointer)0x0;
    local_7f8._16_8_ = 0;
    local_7e0._8_4_ = PARALLEL;
    local_7d0[0] = local_b00[0];
    local_7d0[1] = local_b00[1];
    local_7d0[2] = local_b00[2];
    local_7d0[3] = local_b00[3];
    local_7d0[4] = local_b00[4];
    local_7d0[5] = local_b00[5];
    local_7d0[6] = local_b00[6];
    local_7d0[7] = local_b00[7];
    local_7c8 = (Topology *)&j2_3;
    local_7c0 = (Node *)&mutex2_3;
    local_7b8 = &collection2_3;
    local_7b0 = (byte  [8])&mybuffer2;
    local_7a8 = (void *)local_ac0._M_i;
    local_7a0 = SERIAL;
    local_798.buff[0] = local_b00[0];
    local_798.buff[1] = local_b00[1];
    local_798.buff[2] = local_b00[2];
    local_798.buff[3] = local_b00[3];
    local_798.buff[4] = local_b00[4];
    local_798.buff[5] = local_b00[5];
    local_798.buff[6] = local_b00[6];
    local_798.buff[7] = local_b00[7];
    local_790.buff = (byte  [8])&source;
    local_788.buff = (byte  [8])&j2_2;
    local_778.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_ac0._M_i;
    local_770._8_1_ = local_b00[0];
    local_770._9_1_ = local_b00[1];
    local_770._10_1_ = local_b00[2];
    local_770._11_1_ = local_b00[3];
    local_770._12_1_ = local_b00[4];
    local_770._13_1_ = local_b00[5];
    local_770._14_1_ = local_b00[6];
    local_770._15_1_ = local_b00[7];
    local_770._24_8_ = &j2_1;
    local_770._40_8_ = local_ac0._M_i;
    local_770._48_8_ = 0x200000002;
    local_720 = (pointer)0x0;
    collection2_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    collection2_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    cnt2 = 1;
    local_730._M_t.
    super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
    super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl =
         (tuple<tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>)
         (_Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>)0x0;
    eStack_728._M_exception_object = (void *)0x0;
    local_780.buff = local_7b0;
    local_770._0_4_ = local_7a0;
    local_770._16_8_ = local_790.buff;
    local_770._32_8_ = local_7b0;
    local_738.type = local_7e0._8_4_;
    if ((void *)local_ac0._M_i == (void *)0x0) {
      local_730._M_t.
      super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
      super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl =
           (tuple<tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>)
           (_Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>)0x0
      ;
    }
    else {
      local_730._M_t.
      super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
      super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl =
           (tuple<tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>)
           operator_new(L * 0x18);
    }
    local_720 = (pointer)((long)&((Semaphores *)
                                 local_730._M_t.
                                 super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                                 .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl)
                                 ->to_acquire + L * 0x18);
    eStack_728._M_exception_object =
         (void *)local_730._M_t.
                 super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                 .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl;
    _Var12._M_i = _Var2._M_i;
    while (bVar16 = (void *)_Var12._M_i != (void *)0x0, _Var12._M_i = _Var12._M_i - 1, bVar16) {
      *(undefined8 *)eStack_728._M_exception_object = 0;
      *(undefined8 *)((long)eStack_728._M_exception_object + 8) = 0;
      *(undefined8 *)((long)eStack_728._M_exception_object + 0x10) = 0;
      eStack_728._M_exception_object = eStack_728._M_exception_object + 0x18;
    }
    std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
              (&local_718,local_ab8,(allocator_type *)&local_608);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
              (&local_700,_Var2._M_i,(allocator_type *)&local_608);
    std::
    queue<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
    ::
    queue<std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>,void>
              (&local_6e8);
    local_698._M_buckets = local_898;
    local_698._M_bucket_count = 1;
    local_8a0->_M_nxt = (_Hash_node_base *)0x0;
    local_8a0[1] = (_Hash_node_base *)0x0;
    local_698._M_rehash_policy._M_max_load_factor = 1.0;
    *local_8a8 = 0;
    local_8a8[1] = 0;
    local_660._M_buckets = &local_660._M_single_bucket;
    local_660._M_bucket_count = 1;
    local_660._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_660._M_element_count = 0;
    local_660._M_rehash_policy._M_max_load_factor = 1.0;
    local_890[2] = 0;
    *local_890 = 0;
    local_890[1] = 0;
    if ((void *)_Var2._M_i == (void *)0x0) {
      tf::throw_re<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x22e,(char (*) [28])"must have at least one line");
    }
    if (local_770._0_4_ != 2) {
      tf::throw_re<char_const(&)[26]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x232,(char (*) [26])"first pipe must be serial");
    }
    local_7e0._0_8_ = 0;
    lVar14 = 0x28;
    for (uVar15 = 0;
        uVar15 < (ulong)(((long)local_700.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_700.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar15 = uVar15 + 1) {
      *(undefined8 *)
       ((long)local_700.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
              super__Vector_impl_data._M_start + lVar14 + -0x20) = 0;
      *(ulong *)((long)local_700.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar14 + -0x28) = uVar15;
      *(undefined8 *)
       ((long)local_700.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
              super__Vector_impl_data._M_start + lVar14 + -8) = 0;
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)((long)&(local_700.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                          _M_impl.super__Vector_impl_data._M_start)->_line + lVar14));
      lVar14 = lVar14 + 0x60;
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&local_698);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&local_660);
    *(undefined8 *)
     local_730._M_t.
     super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
     super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = 0;
    lVar14 = 0x20;
    for (uVar15 = 1;
        uVar15 < (ulong)(((long)local_700.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_700.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar15 = uVar15 + 1) {
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        *(long *)((SmallVector<tf::Semaphore_*,_2U> *)
                  ((long)local_730._M_t.
                         super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                         .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl +
                  lVar4 * 8) + lVar14) = (long)*(int *)((long)&local_770 + lVar4 * 4 + 0x34U);
      }
      lVar14 = lVar14 + 0x18;
    }
    for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
      *(undefined8 *)
       ((long)local_730._M_t.
              super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
              .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl + (lVar14 + 1) * 8)
           = 1;
    }
    lVar14 = 0x18;
    for (uVar15 = 1;
        uVar15 < (ulong)(((long)local_700.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_700.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar15 = uVar15 + 1) {
      *(long *)((long)local_730._M_t.
                      super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                      .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl + lVar14) =
           (long)(int)local_770._48_4_ + -1;
      lVar14 = lVar14 + 0x18;
    }
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0xd8);
    ((local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
         (Node *)(local_608._graph.
                  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 3);
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    *(undefined1 *)
     &local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[3]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = 0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[6]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[7]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[8]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[9]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
         (Node *)(local_608._graph.
                  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 0xc);
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[10]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
         (Node *)(local_608._graph.
                  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 0xc);
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xb]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
         (Node *)(local_608._graph.
                  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x10]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x12]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x11]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)local_7f8;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x14]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
         (Node *)std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
                 ::_M_invoke;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x13]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
         (Node *)std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
                 ::_M_manager;
    *(undefined1 *)
     &local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0x18]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = 4;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x19]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x1a]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)local_7f8,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_608);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_608);
    pNVar8 = *(Node **)(local_7f8._8_8_ + 0xfffffffffffffff8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,"cond",(allocator<char> *)&local_960);
    std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
    (local_718.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
     super__Vector_impl_data._M_start)->_node = pNVar8;
    std::__cxx11::string::~string((string *)&local_608);
    pNVar8 = (Node *)0x0;
    while( true ) {
      FVar3._graph = taskflow.super_FlowBuilder._graph;
      if ((Node *)(((long)local_700.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_700.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x60) <= pNVar8) break;
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0xd8);
      ((local_608._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
           (Node *)(local_608._graph.
                    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    .
                    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 3);
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
      *(undefined1 *)
       &local_608._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3]._M_t.
        super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
        super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
        super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = 0;
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[6]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[7]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[8]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[9]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
           (Node *)(local_608._graph.
                    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    .
                    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0xc);
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[10]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
           (Node *)(local_608._graph.
                    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    .
                    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0xc);
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0xb]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
           (Node *)(local_608._graph.
                    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    .
                    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x10);
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0x10]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0x11]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)local_7f8;
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0x12]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = pNVar8;
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0x14]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
           (Node *)std::
                   _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
                   ::_M_invoke;
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0x13]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
           (Node *)std::
                   _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
                   ::_M_manager;
      *(undefined1 *)
       &local_608._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[0x18]._M_t.
        super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
        super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
        super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = 2;
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0x19]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
      local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0x1a]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)local_7f8,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_608);
      std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
                ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_608);
      pNVar1 = *(Node **)(local_7f8._8_8_ + 0xfffffffffffffff8);
      s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_960,
                   "rt-",3);
      std::__cxx11::to_string((string *)&mutex3_2,(unsigned_long)pNVar8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_608
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_960,(string *)&mutex3_2);
      std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
      local_718.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
      super__Vector_impl_data._M_start[(long)((long)&pNVar8->_nstate + 1)]._node = pNVar1;
      std::__cxx11::string::~string((string *)&local_608);
      std::__cxx11::string::~string((string *)&mutex3_2);
      std::__cxx11::string::~string((string *)&local_960);
      tf::Task::precede<tf::Task&>
                (local_718.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_718.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)((long)&pNVar8->_nstate + 1));
      pNVar8 = (Node *)((long)&pNVar8->_nstate + 1);
    }
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0xd8);
    ((local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
         (Node *)(local_608._graph.
                  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 3);
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    *(undefined1 *)
     &local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[3]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = 0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[6]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[7]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[8]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[9]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
         (Node *)(local_608._graph.
                  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 0xc);
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[10]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
         (Node *)(local_608._graph.
                  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 0xc);
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xb]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
         (Node *)(local_608._graph.
                  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x10]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x11]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)local_7f8;
    *(undefined1 *)
     &local_608._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0x18]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = 6;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x19]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x1a]._M_t.
    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar3._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_608);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_608);
    pNVar8 = ((FVar3._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,"module_of_pipeline2",(allocator<char> *)&local_960);
    std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
    pipeline2._node = pNVar8;
    std::__cxx11::string::~string((string *)&local_608);
    FVar3 = taskflow.super_FlowBuilder;
    puVar7 = (pointer)operator_new(0xd8);
    (puVar7->_M_t).super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    puVar7[1]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)(puVar7 + 3);
    puVar7[2]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    *(undefined1 *)
     &puVar7[3]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = 0;
    puVar7[5]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    puVar7[6]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    puVar7[7]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    puVar7[8]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    puVar7[9]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)(puVar7 + 0xc);
    puVar7[10]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)(puVar7 + 0xc);
    puVar7[0xb]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)(puVar7 + 0x10);
    puVar7[0x10]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    puVar7[0x11]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    puVar7[0x12]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    puVar7[0x13]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    puVar7[0x14]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    pNVar8 = (Node *)operator_new(0x38);
    *(size_t **)pNVar8 = &j2_1;
    (pNVar8->_name)._M_dataplus._M_p = (pointer)local_b00;
    (pNVar8->_name)._M_string_length = (size_type)&j2_2;
    (pNVar8->_name).field_2._M_allocated_capacity = (size_type)&j2_3;
    *(vector<int,_std::allocator<int>_> **)((long)&(pNVar8->_name).field_2 + 8) = &collection2_3;
    pNVar8->_data = local_7f8;
    pNVar8->_topology = (Topology *)&cnt2;
    puVar7[0x11]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = pNVar8;
    puVar7[0x14]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
         (Node *)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1161:35)>
                 ::_M_invoke;
    puVar7[0x13]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl =
         (Node *)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1161:35)>
                 ::_M_manager;
    *(undefined1 *)
     &puVar7[0x18]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = 1;
    puVar7[0x19]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    puVar7[0x1a]._M_t.super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl = (Node *)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar7;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar3._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_608);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_608);
    pNVar8 = ((FVar3._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,"test2",(allocator<char> *)&local_960);
    std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
    test2._node = pNVar8;
    std::__cxx11::string::~string((string *)&local_608);
    tf::Node::_precede(pipeline2._node,test2._node);
    _Var2._M_i = local_ac0._M_i;
    j3_1 = 0;
    j3_2.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    mutex3_2.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    collection3_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    mutex3_2.super___mutex_base._M_mutex._16_8_ = 0;
    mutex3_2.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    mutex3_2.super___mutex_base._M_mutex.__align = 0;
    mutex3_2.super___mutex_base._M_mutex._8_8_ = 0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_608._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._type = PARALLEL;
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._callable.N._0_1_ = local_b00[0];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._callable.N._1_1_ = local_b00[1];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._callable.N._2_1_ = local_b00[2];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._callable.N._3_1_ = local_b00[3];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._callable.N._4_1_ = local_b00[4];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._callable.N._5_1_ = local_b00[5];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._callable.N._6_1_ = local_b00[6];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._callable.N._7_1_ = local_b00[7];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._callable.collection3_2 = &collection3_2;
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._callable.mutex3_2 = &mutex3_2;
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._callable.j3_2 = &j3_2;
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._callable.mybuffer3 = &mybuffer3;
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
    ._M_head_impl._callable.L = local_ac0._M_i;
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
    ._M_head_impl._type = SERIAL;
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
    ._M_head_impl._callable.N._0_1_ = local_b00[0];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
    ._M_head_impl._callable.N._1_1_ = local_b00[1];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
    ._M_head_impl._callable.N._2_1_ = local_b00[2];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
    ._M_head_impl._callable.N._3_1_ = local_b00[3];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
    ._M_head_impl._callable.N._4_1_ = local_b00[4];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
    ._M_head_impl._callable.N._5_1_ = local_b00[5];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
    ._M_head_impl._callable.N._6_1_ = local_b00[6];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
    ._M_head_impl._callable.N._7_1_ = local_b00[7];
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
    ._M_head_impl._callable.source = &source;
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
    ._M_head_impl._callable.j3_1 = &j3_1;
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
    ._M_head_impl._callable.L = local_ac0._M_i;
    local_608._meta._M_elems[0].type = SERIAL;
    local_608._meta._M_elems[1].type = PARALLEL;
    local_608._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    collection3_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    collection3_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    cnt3 = 1;
    local_608._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_608._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_608._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
    ._M_head_impl._callable.mybuffer3 =
         local_608._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
         .
         super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>,_false>
         ._M_head_impl._callable.mybuffer3;
    if ((void *)local_ac0._M_i == (void *)0x0) {
      local_608._lines.
      super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      local_608._lines.
      super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(L * 0x10);
    }
    local_608._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_608._lines.
         super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start + L;
    local_608._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_608._lines.
         super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    _Var12._M_i = _Var2._M_i;
    while (bVar16 = (void *)_Var12._M_i != (void *)0x0, _Var12._M_i = _Var12._M_i - 1, bVar16) {
      (local_608._lines.
       super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[0].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      (local_608._lines.
       super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[1].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      local_608._lines.
      super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_608._lines.
           super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
              (&local_608._tasks,local_ab8,(allocator_type *)&local_960);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
              (&local_608._pipeflows,_Var2._M_i,(allocator_type *)&local_960);
    std::
    queue<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
    ::
    queue<std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>,void>
              (&local_608._ready_tokens);
    local_608._token_dependencies._M_h._M_buckets =
         &local_608._token_dependencies._M_h._M_single_bucket;
    local_608._token_dependencies._M_h._M_bucket_count = 1;
    local_8b0->_M_nxt = (_Hash_node_base *)0x0;
    local_8b0[1] = (_Hash_node_base *)0x0;
    local_608._token_dependencies._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_608._token_dependencies._M_h._M_rehash_policy._M_next_resize = 0;
    local_608._token_dependencies._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_608._deferred_tokens._M_h._M_buckets = local_8b8;
    local_608._deferred_tokens._M_h._M_bucket_count = 1;
    local_8c0->_M_nxt = (_Hash_node_base *)0x0;
    local_8c0[1] = (_Hash_node_base *)0x0;
    local_608._deferred_tokens._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_8c8[2] = 0;
    *local_8c8 = 0;
    local_8c8[1] = 0;
    if ((void *)_Var2._M_i == (void *)0x0) {
      tf::throw_re<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x22e,(char (*) [28])"must have at least one line");
    }
    if (local_608._pipes.
        super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
        .
        super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_false>
        ._M_head_impl._type != SERIAL) {
      tf::throw_re<char_const(&)[26]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x232,(char (*) [26])"first pipe must be serial");
    }
    local_608._num_tokens = 0;
    lVar14 = 0x28;
    for (uVar15 = 0;
        uVar15 < (ulong)(((long)local_608._pipeflows.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_608._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar15 = uVar15 + 1) {
      *(undefined8 *)
       ((long)local_608._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar14 + -0x20) = 0;
      *(ulong *)((long)local_608._pipeflows.
                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar14 + -0x28) = uVar15;
      *(undefined8 *)
       ((long)local_608._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar14 + -8) = 0;
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)((long)&(local_608._pipeflows.
                          super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                          super__Vector_impl_data._M_start)->_line + lVar14));
      lVar14 = lVar14 + 0x60;
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&local_608._token_dependencies._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&local_608._deferred_tokens._M_h);
    (local_608._lines.
     super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
    super___atomic_base<unsigned_long>._M_i = 0;
    lVar14 = 0x18;
    for (uVar15 = 1;
        uVar15 < (ulong)(((long)local_608._pipeflows.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_608._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar15 = uVar15 + 1) {
      *(long *)((long)&(local_608._lines.
                        super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
                       super___atomic_base<unsigned_long>._M_i + lVar14) =
           (long)(int)local_608._meta._M_elems[1].type;
      lVar14 = lVar14 + 0x10;
    }
    (local_608._lines.
     super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1].join_counter.
    super___atomic_base<unsigned_long>._M_i = 1;
    lVar14 = 0x10;
    for (uVar15 = 1;
        uVar15 < (ulong)(((long)local_608._pipeflows.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_608._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar15 = uVar15 + 1) {
      *(long *)((long)&(local_608._lines.
                        super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>::Line,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
                       super___atomic_base<unsigned_long>._M_i + lVar14) =
           (long)(int)local_608._meta._M_elems[0].type + -1;
      lVar14 = lVar14 + 0x10;
    }
    local_960.j1_1 = (size_t *)operator_new(0xd8);
    *local_960.j1_1 = 0;
    local_960.j1_1[1] = (size_t)(local_960.j1_1 + 3);
    local_960.j1_1[2] = 0;
    *(undefined1 *)(local_960.j1_1 + 3) = 0;
    local_960.j1_1[5] = 0;
    local_960.j1_1[6] = 0;
    local_960.j1_1[7] = 0;
    local_960.j1_1[8] = 0;
    local_960.j1_1[9] = (size_t)(local_960.j1_1 + 0xc);
    local_960.j1_1[10] = (size_t)(local_960.j1_1 + 0xc);
    local_960.j1_1[0xb] = (size_t)(local_960.j1_1 + 0x10);
    local_960.j1_1[0x10] = 0;
    local_960.j1_1[0x12] = 0;
    local_960.j1_1[0x11] = (size_t)&local_608;
    local_960.j1_1[0x14] =
         (size_t)std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
                 ::_M_invoke;
    local_960.j1_1[0x13] =
         (size_t)std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
                 ::_M_manager;
    *(undefined1 *)(local_960.j1_1 + 0x18) = 4;
    local_960.j1_1[0x19] = 0;
    local_960.j1_1[0x1a] = 0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)&local_608,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_960);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_960);
    pNVar8 = local_608._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_960,"cond",(allocator<char> *)&local_ae8);
    std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
    (local_608._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
     super__Vector_impl_data._M_start)->_node = pNVar8;
    std::__cxx11::string::~string((string *)&local_960);
    for (uVar15 = 0; FVar3._graph = taskflow.super_FlowBuilder._graph,
        uVar15 < (ulong)(((long)local_608._pipeflows.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_608._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar15 = uVar15 + 1) {
      local_960.j1_1 = (size_t *)operator_new(0xd8);
      *local_960.j1_1 = 0;
      local_960.j1_1[1] = (size_t)(local_960.j1_1 + 3);
      local_960.j1_1[2] = 0;
      *(undefined1 *)(local_960.j1_1 + 3) = 0;
      local_960.j1_1[5] = 0;
      local_960.j1_1[6] = 0;
      local_960.j1_1[7] = 0;
      local_960.j1_1[8] = 0;
      local_960.j1_1[9] = (size_t)(local_960.j1_1 + 0xc);
      local_960.j1_1[10] = (size_t)(local_960.j1_1 + 0xc);
      local_960.j1_1[0xb] = (size_t)(local_960.j1_1 + 0x10);
      local_960.j1_1[0x10] = 0;
      local_960.j1_1[0x11] = (size_t)&local_608;
      local_960.j1_1[0x12] = uVar15;
      local_960.j1_1[0x14] =
           (size_t)std::
                   _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
                   ::_M_invoke;
      local_960.j1_1[0x13] =
           (size_t)std::
                   _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
                   ::_M_manager;
      *(undefined1 *)(local_960.j1_1 + 0x18) = 2;
      local_960.j1_1[0x19] = 0;
      local_960.j1_1[0x1a] = 0;
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)&local_608,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_960);
      std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
                ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_960);
      pNVar8 = local_608._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               .
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
               super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
               super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      s_abi_cxx11_(&local_ae8,"rt-",3);
      std::__cxx11::to_string((string *)&promise,uVar15);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_960
                     ,&local_ae8,(string *)&promise);
      std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
      local_608._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
      super__Vector_impl_data._M_start[uVar15 + 1]._node = pNVar8;
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::~string((string *)&promise);
      std::__cxx11::string::~string((string *)&local_ae8);
      tf::Task::precede<tf::Task&>
                (local_608._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_608._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar15 + 1);
    }
    local_960.j1_1 = (size_t *)operator_new(0xd8);
    *local_960.j1_1 = 0;
    local_960.j1_1[1] = (size_t)(local_960.j1_1 + 3);
    local_960.j1_1[2] = 0;
    *(undefined1 *)(local_960.j1_1 + 3) = 0;
    local_960.j1_1[5] = 0;
    local_960.j1_1[6] = 0;
    local_960.j1_1[7] = 0;
    local_960.j1_1[8] = 0;
    local_960.j1_1[9] = (size_t)(local_960.j1_1 + 0xc);
    local_960.j1_1[10] = (size_t)(local_960.j1_1 + 0xc);
    local_960.j1_1[0xb] = (size_t)(local_960.j1_1 + 0x10);
    local_960.j1_1[0x10] = 0;
    local_960.j1_1[0x11] = (size_t)&local_608;
    *(undefined1 *)(local_960.j1_1 + 0x18) = 6;
    local_960.j1_1[0x19] = 0;
    local_960.j1_1[0x1a] = 0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar3._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_960);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_960);
    pNVar8 = ((FVar3._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_960,"module_of_pipeline3",(allocator<char> *)&local_ae8);
    std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
    pipeline3._node = pNVar8;
    std::__cxx11::string::~string((string *)&local_960);
    FVar3 = taskflow.super_FlowBuilder;
    psVar9 = (size_t *)operator_new(0xd8);
    *psVar9 = 0;
    psVar9[1] = (size_t)(psVar9 + 3);
    psVar9[2] = 0;
    *(undefined1 *)(psVar9 + 3) = 0;
    psVar9[5] = 0;
    psVar9[6] = 0;
    psVar9[7] = 0;
    psVar9[8] = 0;
    psVar9[9] = (size_t)(psVar9 + 0xc);
    psVar9[10] = (size_t)(psVar9 + 0xc);
    psVar9[0xb] = (size_t)(psVar9 + 0x10);
    psVar9[0x10] = 0;
    psVar9[0x11] = 0;
    psVar9[0x12] = 0;
    psVar9[0x13] = 0;
    psVar9[0x14] = 0;
    plVar6 = (long *)operator_new(0x30);
    *plVar6 = (long)&j3_1;
    plVar6[1] = (long)local_b00;
    plVar6[2] = (long)&j3_2;
    plVar6[3] = (long)&collection3_2;
    plVar6[4] = (long)&local_608;
    plVar6[5] = (long)&cnt3;
    psVar9[0x11] = (size_t)plVar6;
    psVar9[0x14] = (size_t)std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1210:35)>
                           ::_M_invoke;
    psVar9[0x13] = (size_t)std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1210:35)>
                           ::_M_manager;
    *(undefined1 *)(psVar9 + 0x18) = 1;
    psVar9[0x19] = 0;
    psVar9[0x1a] = 0;
    local_960.j1_1 = psVar9;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar3._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_960);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_960);
    pNVar8 = ((FVar3._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_960,"test3",(allocator<char> *)&local_ae8);
    std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
    test3._node = pNVar8;
    std::__cxx11::string::~string((string *)&local_960);
    tf::Node::_precede(pipeline3._node,test3._node);
    FVar3 = taskflow.super_FlowBuilder;
    local_960.j1_1 = (size_t *)operator_new(0xd8);
    *local_960.j1_1 = 0;
    local_960.j1_1[1] = (size_t)(local_960.j1_1 + 3);
    local_960.j1_1[2] = 0;
    *(undefined1 *)(local_960.j1_1 + 3) = 0;
    local_960.j1_1[5] = 0;
    local_960.j1_1[6] = 0;
    local_960.j1_1[7] = 0;
    local_960.j1_1[8] = 0;
    local_960.j1_1[9] = (size_t)(local_960.j1_1 + 0xc);
    local_960.j1_1[10] = (size_t)(local_960.j1_1 + 0xc);
    local_960.j1_1[0xb] = (size_t)(local_960.j1_1 + 0x10);
    local_960.j1_1[0x10] = 0;
    local_960.j1_1[0x11] = 0;
    local_960.j1_1[0x12] = 0;
    local_960.j1_1[0x14] =
         (size_t)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1224:38)>
                 ::_M_invoke;
    local_960.j1_1[0x13] =
         (size_t)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1224:38)>
                 ::_M_manager;
    *(undefined1 *)(local_960.j1_1 + 0x18) = 1;
    local_960.j1_1[0x19] = 0;
    local_960.j1_1[0x1a] = 0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar3._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_960);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_960);
    pNVar8 = ((FVar3._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_960,"initial",(allocator<char> *)&local_ae8);
    std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
    initial._node = pNVar8;
    std::__cxx11::string::~string((string *)&local_960);
    FVar3 = taskflow.super_FlowBuilder;
    local_960.j1_1 = (size_t *)operator_new(0xd8);
    *local_960.j1_1 = 0;
    local_960.j1_1[1] = (size_t)(local_960.j1_1 + 3);
    local_960.j1_1[2] = 0;
    *(undefined1 *)(local_960.j1_1 + 3) = 0;
    local_960.j1_1[5] = 0;
    local_960.j1_1[6] = 0;
    local_960.j1_1[7] = 0;
    local_960.j1_1[8] = 0;
    local_960.j1_1[9] = (size_t)(local_960.j1_1 + 0xc);
    local_960.j1_1[10] = (size_t)(local_960.j1_1 + 0xc);
    local_960.j1_1[0xb] = (size_t)(local_960.j1_1 + 0x10);
    local_960.j1_1[0x10] = 0;
    local_960.j1_1[0x11] = 0;
    local_960.j1_1[0x12] = 0;
    local_960.j1_1[0x14] =
         (size_t)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1225:38)>
                 ::_M_invoke;
    local_960.j1_1[0x13] =
         (size_t)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1225:38)>
                 ::_M_manager;
    *(undefined1 *)(local_960.j1_1 + 0x18) = 1;
    local_960.j1_1[0x19] = 0;
    local_960.j1_1[0x1a] = 0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar3._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_960);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_960);
    pNVar8 = ((FVar3._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_960,"terminal",(allocator<char> *)&local_ae8);
    std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
    terminal._node = pNVar8;
    std::__cxx11::string::~string((string *)&local_960);
    tf::Task::precede<tf::Task&,tf::Task&,tf::Task&>(&initial,&pipeline1,&pipeline2,&pipeline3);
    tf::Task::succeed<tf::Task&,tf::Task&,tf::Task&>(&terminal,&test1,&test2,&test3);
    local_960.j1_1 = &j1_1;
    local_960.j1_2 = &j1_2;
    local_960.j1_3 = &j1_3;
    local_960.j1_4 = &j1_4;
    local_960.mybuffer1 = &mybuffer1;
    local_960.cnt1 = &cnt1;
    local_960.j2_1 = &j2_1;
    local_960.j2_2 = &j2_2;
    local_960.j2_3 = &j2_3;
    local_960.collection2_3 = &collection2_3;
    local_960.mybuffer2 = &mybuffer2;
    local_960.cnt2 = &cnt2;
    local_960.j3_1 = &j3_1;
    local_960.j3_2 = &j3_2;
    local_960.collection3_2 = &collection3_2;
    local_960.mybuffer3 = &mybuffer3;
    local_960.cnt3 = &cnt3;
    tf::Executor::_increment_topology(&executor);
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      three_parallel_pipelines::anon_class_136_17_4ca99117::operator()(&local_960);
      std::promise<void>::promise(&promise);
      std::promise<void>::set_value(&promise);
      tf::Executor::_decrement_topology(&executor);
      std::__basic_future<void>::__basic_future((__basic_future<void> *)&t,&promise._M_future);
      local_ae8._M_dataplus._M_p =
           (pointer)t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_ae8._M_string_length =
           (size_type)
           t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_ae8.field_2._M_allocated_capacity = 0;
      local_ae8.field_2._8_8_ = 0;
      local_268 = 0;
      _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_260);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::promise<void>::~promise(&promise);
    }
    else {
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      p_Var10 = std::
                allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
                ::allocate(&__a2,1);
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&__a2;
      (p_Var10->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var10->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var10->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00177cf8;
      (p_Var10->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&taskflow;
      this = (promise<void> *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 8);
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = &p_Var10->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::promise<void>::promise(this);
      *(undefined8 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x28) = 0;
      *(undefined8 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x20) = 2;
      *(code **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x38) =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_invoke;
      *(code **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x30) =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_manager;
      *(undefined8 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x40) = 0;
      *(undefined8 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x48) = 0;
      *(undefined8 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x50) = 0;
      *(undefined8 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x58) = 0;
      __dest = operator_new(0x88);
      memcpy(__dest,&local_960,0x88);
      *(void **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x40) = __dest;
      *(code **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x58) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1232:33)>
           ::_M_invoke;
      *(code **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x50) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1232:33)>
           ::_M_manager;
      *(undefined8 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x60) = 0;
      *(undefined4 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x68) = 0;
      *(undefined8 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x70) = 0;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&p_Var10->_M_impl;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           &p_Var10->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&promise);
      std::__basic_future<void>::__basic_future
                ((__basic_future<void> *)&promise,(__state_type *)this);
      std::__weak_ptr<tf::Topology,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<tf::Topology,void>
                ((__weak_ptr<tf::Topology,(__gnu_cxx::_Lock_policy)2> *)&local_8d8,
                 &t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>);
      local_ae8._M_dataplus._M_p =
           (pointer)promise._M_future.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
      local_ae8._M_string_length =
           (size_type)
           promise._M_future.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_ae8.field_2._M_allocated_capacity = local_8d8;
      local_ae8.field_2._8_8_ = _Stack_8d0._M_pi;
      local_8d8 = 0;
      _Stack_8d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_8d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&promise._M_future.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::mutex::lock(&taskflow._mutex);
      std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
      push_back(&taskflow._topologies.c,
                (value_type *)&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>);
      sVar11 = std::
               deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
               ::size(&taskflow._topologies.c);
      if (sVar11 == 1) {
        tf::Executor::_set_up_topology
                  (&executor,*(Worker **)(in_FS_OFFSET + -8),
                   t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&taskflow._mutex);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::future<void>::get((future<void> *)&local_ae8);
    tf::Future<void>::~Future((Future<void> *)&local_ae8);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1187:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1199:7)>_>
    ::~Pipeline(&local_608);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&collection3_2.super__Vector_base<int,_std::allocator<int>_>);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1131:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1142:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1150:40)>_>
    ::~Pipeline((Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1131:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1142:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1150:40)>_>
                 *)local_7f8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&collection2_3.super__Vector_base<int,_std::allocator<int>_>);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1074:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1085:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1093:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1101:38)>_>
    ::~Pipeline(&local_468);
    tf::Taskflow::~Taskflow(&taskflow);
    local_b00 = (byte  [8])((long)local_b00 + 1);
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

void three_parallel_pipelines(size_t L, unsigned w) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);
  std::vector<std::array<int, 4>> mybuffer1(L);
  std::vector<std::array<int, 3>> mybuffer2(L);
  std::vector<std::array<int, 2>> mybuffer3(L);

  for(size_t N = 0; N <= maxN; N++) {

    tf::Taskflow taskflow;

    size_t j1_1 = 0, j1_2 = 0, j1_3 = 0, j1_4 = 0;
    size_t cnt1 = 1;

    // pipeline 1 is SSSS
    tf::Pipeline pl1(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1_1, &mybuffer1, L](auto& pf) mutable {
        if(j1_1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j1_1 == source[j1_1]);
        REQUIRE(pf.token() % L == pf.line());
        mybuffer1[pf.line()][pf.pipe()] = source[j1_1] + 1;
        j1_1++;
      }},

      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1_2, &mybuffer1, L](auto& pf) mutable {
        REQUIRE(j1_2 < N);
        REQUIRE(pf.token() % L == pf.line());
        REQUIRE(source[j1_2] + 1 == mybuffer1[pf.line()][pf.pipe() - 1]);
        mybuffer1[pf.line()][pf.pipe()] = source[j1_2] + 1;
        j1_2++;
      }},

      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1_3, &mybuffer1, L](auto& pf) mutable {
        REQUIRE(j1_3 < N);
        REQUIRE(pf.token() % L == pf.line());
        REQUIRE(source[j1_3] + 1 == mybuffer1[pf.line()][pf.pipe() - 1]);
        mybuffer1[pf.line()][pf.pipe()] = source[j1_3] + 1;
        j1_3++;
      }},

      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1_4, &mybuffer1, L](auto& pf) mutable {
        REQUIRE(j1_4 < N);
        REQUIRE(pf.token() % L == pf.line());
        REQUIRE(source[j1_4] + 1 == mybuffer1[pf.line()][pf.pipe() - 1]);
        j1_4++;
      }}
    );

    auto pipeline1 = taskflow.composed_of(pl1).name("module_of_pipeline1");
    auto test1 = taskflow.emplace([&](){
      REQUIRE(j1_1 == N);
      REQUIRE(j1_2 == N);
      REQUIRE(j1_3 == N);
      REQUIRE(j1_4 == N);
      REQUIRE(pl1.num_tokens() == cnt1 * N);
    }).name("test1");

    pipeline1.precede(test1);



    // the followings are definitions for pipeline 2
    size_t j2_1 = 0, j2_2 = 0;
    std::atomic<size_t> j2_3 = 0;
    std::mutex mutex2_3;
    std::vector<int> collection2_3;
    size_t cnt2 = 1;

    // pipeline 2 is SSP
    tf::Pipeline pl2(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j2_1, &mybuffer2, L](auto& pf) mutable {
        if(j2_1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j2_1 == source[j2_1]);
        REQUIRE(pf.token() % L == pf.line());
        mybuffer2[pf.line()][pf.pipe()] = source[j2_1] + 1;
        j2_1++;
      }},

      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j2_2, &mybuffer2, L](auto& pf) mutable {
        REQUIRE(j2_2 < N);
        REQUIRE(source[j2_2] + 1 == mybuffer2[pf.line()][pf.pipe() - 1]);
        REQUIRE(pf.token() % L == pf.line());
        mybuffer2[pf.line()][pf.pipe()] = source[j2_2] + 1;
        j2_2++;
      }},

      tf::Pipe{tf::PipeType::PARALLEL, [N, &j2_3, &mutex2_3, &collection2_3, &mybuffer2, L](auto& pf) mutable {
        REQUIRE(j2_3++ < N);
        {
          std::scoped_lock<std::mutex> lock(mutex2_3);
          REQUIRE(pf.token() % L == pf.line());
          collection2_3.push_back(mybuffer2[pf.line()][pf.pipe() - 1]);
        }
      }}
    );

    auto pipeline2 = taskflow.composed_of(pl2).name("module_of_pipeline2");
    auto test2 = taskflow.emplace([&](){
      REQUIRE(j2_1 == N);
      REQUIRE(j2_2 == N);
      REQUIRE(j2_3 == N);
      REQUIRE(collection2_3.size() == N);

      std::sort(collection2_3.begin(), collection2_3.end());
      for (size_t i = 0; i < N; ++i) {
        REQUIRE(collection2_3[i] == i + 1);
      }
      REQUIRE(pl2.num_tokens() == cnt2 * N);
    }).name("test2");

    pipeline2.precede(test2);



    // the followings are definitions for pipeline 3
    size_t j3_1 = 0;
    std::atomic<size_t> j3_2 = 0;
    std::mutex mutex3_2;
    std::vector<int> collection3_2;
    size_t cnt3 = 1;

    // pipeline 3 is SP
    tf::Pipeline pl3(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j3_1, &mybuffer3, L](auto& pf) mutable {
        if(j3_1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j3_1 == source[j3_1]);
        REQUIRE(pf.token() % L == pf.line());
        mybuffer3[pf.line()][pf.pipe()] = source[j3_1] + 1;
        j3_1++;
      }},

      tf::Pipe{tf::PipeType::PARALLEL,
      [N, &collection3_2, &mutex3_2, &j3_2, &mybuffer3, L](auto& pf) mutable {
        REQUIRE(j3_2++ < N);
        {
          std::scoped_lock<std::mutex> lock(mutex3_2);
          REQUIRE(pf.token() % L == pf.line());
          collection3_2.push_back(mybuffer3[pf.line()][pf.pipe() - 1]);
        }
      }}
    );

    auto pipeline3 = taskflow.composed_of(pl3).name("module_of_pipeline3");
    auto test3 = taskflow.emplace([&](){
      REQUIRE(j3_1 == N);
      REQUIRE(j3_2 == N);

      std::sort(collection3_2.begin(), collection3_2.end());
      for(size_t i = 0; i < N; i++) {
        REQUIRE(collection3_2[i] == i + 1);
      }
      REQUIRE(pl3.num_tokens() == cnt3 * N);
    }).name("test3");

    pipeline3.precede(test3);


    auto initial  = taskflow.emplace([](){}).name("initial");
    auto terminal = taskflow.emplace([](){}).name("terminal");

    initial.precede(pipeline1, pipeline2, pipeline3);
    terminal.succeed(test1, test2, test3);

    //taskflow.dump(std::cout);

    executor.run_n(taskflow, 3, [&]() mutable {
      // reset variables for pipeline 1
      j1_1 = j1_2 = j1_3 = j1_4 = 0;
      for(size_t i = 0; i < mybuffer1.size(); ++i){
        for(size_t j = 0; j < mybuffer1[0].size(); ++j){
          mybuffer1[i][j] = 0;
        }
      }
      cnt1++;

      // reset variables for pipeline 2
      j2_1 = j2_2 = j2_3 = 0;
      collection2_3.clear();
      for(size_t i = 0; i < mybuffer2.size(); ++i){
        for(size_t j = 0; j < mybuffer2[0].size(); ++j){
          mybuffer2[i][j] = 0;
        }
      }
      cnt2++;

      // reset variables for pipeline 3
      j3_1 = j3_2 = 0;
      collection3_2.clear();
      for(size_t i = 0; i < mybuffer3.size(); ++i){
        for(size_t j = 0; j < mybuffer3[0].size(); ++j){
          mybuffer3[i][j] = 0;
        }
      }
      cnt3++;
    }).get();


  }
}